

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O2

Segment * __thiscall
mnf::Manifold::getView<0>(Segment *__return_storage_ptr__,Manifold *this,RefVec *val,size_t i)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  Index start;
  Index size;
  
  uVar2 = (**(code **)(*(long *)this + 0x38))(this);
  mnf_assert(i < uVar2);
  lVar1 = *(long *)&(val->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  lVar3 = mnf::Manifold::representationDim();
  mnf_assert(lVar1 == lVar3);
  start = getStart<0>(this,i);
  size = getDim<0>(this,i);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(__return_storage_ptr__,val,start,size);
  return __return_storage_ptr__;
}

Assistant:

inline Segment Manifold::getView(RefVec val, size_t i) const
{
  mnf_assert(i < numberOfSubManifolds() && "invalid index");
  mnf_assert(val.size() == getDim<D>());
  return val.segment(getStart<D>(i), getDim<D>(i));
}